

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn_lex.cpp
# Opt level: O1

string * __thiscall util::Lexer::ReadToken_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  char cVar1;
  _Elt_pointer pbVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  string *psVar7;
  char c;
  char local_61;
  string *local_60;
  code *local_58 [2];
  code *local_48;
  code *pcStack_40;
  
  local_60 = __return_storage_ptr__;
  do {
    local_58[1] = (code *)0x0;
    local_58[0] = ctype_whitespace;
    pcStack_40 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_invoke;
    local_48 = std::_Function_handler<bool_(char),_bool_(*)(char)>::_M_manager;
    bVar4 = GetCharIf(this,&local_61,(function<bool_(char)> *)local_58);
    if (local_48 != (code *)0x0) {
      (*local_48)((_Any_data *)local_58,(_Any_data *)local_58,__destroy_functor);
    }
    psVar7 = local_60;
  } while (bVar4);
  pbVar2 = (this->token_buffer).c.
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->token_buffer).c.
      super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == pbVar2) {
    iVar5 = std::istream::peek();
    psVar7 = local_60;
    if (iVar5 == -1) {
      (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
      local_60->_M_string_length = 0;
      (local_60->field_2)._M_local_buf[0] = '\0';
    }
    else {
      local_61 = (char)iVar5;
      pcVar6 = "(),&|=!<>+-*/%&|!~";
      do {
        cVar1 = *pcVar6;
        if (cVar1 == local_61) break;
        pcVar6 = pcVar6 + 1;
      } while (cVar1 != '\0');
      if (cVar1 == '\0') {
        ReadValue_abi_cxx11_(local_60,this);
      }
      else {
        ReadOperator_abi_cxx11_(local_60,this);
      }
    }
  }
  else {
    (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
    pcVar3 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,pcVar3,pcVar3 + pbVar2->_M_string_length);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&(this->token_buffer).c);
  }
  return psVar7;
}

Assistant:

std::string Lexer::ReadToken()
	{
		char c;

		while (this->GetCharIf(c, ctype_whitespace)) ; // no loop body

		if (!this->token_buffer.empty())
		{
			std::string token = this->token_buffer.front();
			this->token_buffer.pop();
			return token;
		}

		if (this->PeekChar(c))
		{
			if (ctype_op(c))
			{
				return this->ReadOperator();
			}
			else
			{
				return this->ReadValue();
			}
		}

		return {};
	}